

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall Compiler::validateArgumentCount(Compiler *this,uint expected,uint got)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __cxx11 local_a8 [48];
  __cxx11 local_78 [32];
  char local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  uint local_18;
  uint local_14;
  uint got_local;
  uint expected_local;
  Compiler *this_local;
  
  if (expected != got) {
    local_18 = got;
    local_14 = expected;
    _got_local = this;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x20);
    std::__cxx11::to_string(local_78,local_18);
    std::operator+(local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Malformed argument list, got ");
    std::operator+(local_38,local_58);
    std::__cxx11::to_string(local_a8,local_14);
    std::operator+(__lhs,local_38);
    __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  return;
}

Assistant:

void Compiler::validateArgumentCount(unsigned int expected, unsigned int got)
{
    if(expected != got)
    {
        throw std::string("Malformed argument list, got " + std::to_string(got) + " when expected " + std::to_string(expected));
    }
}